

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O1

Ivy_Init_t Ivy_InitNotCond(Ivy_Init_t Init,int fCompl)

{
  Ivy_Init_t IVar1;
  
  if (Init != IVY_INIT_NONE) {
    IVar1 = IVY_INIT_1;
    if (Init != IVY_INIT_0) {
      IVar1 = (uint)(Init != IVY_INIT_1) * 2 + IVY_INIT_0;
    }
    if (fCompl == 0) {
      IVar1 = Init;
    }
    return IVar1;
  }
  __assert_fail("Init != IVY_INIT_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivy.h"
                ,0x149,"Ivy_Init_t Ivy_InitNotCond(Ivy_Init_t, int)");
}

Assistant:

static Ivy_Init_t Ivy_InitNotCond( Ivy_Init_t Init, int fCompl )
{
    assert( Init != IVY_INIT_NONE );
    if ( fCompl == 0 )
        return Init;
    if ( Init == IVY_INIT_0 )
        return IVY_INIT_1;
    if ( Init == IVY_INIT_1 )
        return IVY_INIT_0;
    return IVY_INIT_DC;
}